

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::
SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
::emplaceRealloc<>(SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   *this,pointer pos)

{
  EVP_PKEY_CTX *pEVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  pointer puVar5;
  size_type sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer puVar9;
  undefined8 uVar10;
  EVP_PKEY_CTX *pEVar11;
  long lVar12;
  long lVar13;
  EVP_PKEY_CTX *ctx;
  ulong uVar14;
  
  if (this->len == 0x2aaaaaaaaaaaaaa) {
    detail::throwLengthError();
  }
  uVar14 = this->len + 1;
  uVar4 = this->cap;
  if (uVar14 < uVar4 * 2) {
    uVar14 = uVar4 * 2;
  }
  if (0x2aaaaaaaaaaaaaa - uVar4 < uVar4) {
    uVar14 = 0x2aaaaaaaaaaaaaa;
  }
  lVar13 = (long)pos - (long)this->data_;
  puVar9 = (pointer)operator_new(uVar14 * 0x30);
  *(undefined8 *)((long)puVar9 + lVar13) = 0x3f;
  *(undefined8 *)((long)puVar9 + lVar13 + 8) = 1;
  puVar2 = (undefined8 *)((long)puVar9 + lVar13 + 0x10);
  *puVar2 = 0;
  puVar2[1] = 0;
  *(undefined1 **)((long)puVar9 + lVar13 + 0x10) =
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  uVar10 = 0x1d;
  if (*(long *)((long)puVar9 + lVar13 + 0x18) == 0) {
    uVar10 = 0;
  }
  *(undefined8 *)((long)puVar9 + lVar13 + 0x20) = uVar10;
  *(undefined8 *)((long)puVar9 + lVar13 + 0x28) = 0;
  puVar5 = this->data_;
  ctx = (EVP_PKEY_CTX *)this->len;
  pEVar11 = (EVP_PKEY_CTX *)(puVar5 + (long)ctx);
  if (pEVar11 == (EVP_PKEY_CTX *)pos) {
    if (ctx != (EVP_PKEY_CTX *)0x0) {
      ctx = (EVP_PKEY_CTX *)0x0;
      do {
        pEVar1 = ctx + (long)&puVar5->table_;
        uVar10 = *(undefined8 *)pEVar1;
        uVar7 = *(undefined8 *)(pEVar1 + 8);
        uVar8 = *(undefined8 *)(pEVar1 + 0x18);
        *(undefined8 *)
         (ctx + (long)&(puVar9->table_).
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .arrays.groups_) = *(undefined8 *)(pEVar1 + 0x10);
        *(undefined8 *)
         (ctx + (long)&(puVar9->table_).
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .arrays.groups_ + 8) = uVar8;
        *(undefined8 *)(ctx + (long)&puVar9->table_) = uVar10;
        *(undefined8 *)(ctx + (long)&puVar9->table_ + 8) = uVar7;
        uVar10 = *(undefined8 *)(pEVar1 + 0x28);
        *(undefined8 *)
         (ctx + (long)&(puVar9->table_).
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .size_ctrl) = *(undefined8 *)(pEVar1 + 0x20);
        *(undefined8 *)
         (ctx + (long)&(puVar9->table_).
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .size_ctrl + 8) = uVar10;
        *(undefined8 *)pEVar1 = 0x3f;
        *(undefined8 *)(pEVar1 + 8) = 1;
        *(undefined1 **)(pEVar1 + 0x10) =
             &boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
        *(undefined8 *)(pEVar1 + 0x18) = 0;
        *(undefined8 *)(pEVar1 + 0x20) = 0;
        *(undefined8 *)(pEVar1 + 0x28) = 0;
        ctx = ctx + 0x30;
      } while (pEVar1 + 0x30 != pEVar11);
    }
  }
  else {
    if (puVar5 != pos) {
      lVar12 = 0;
      do {
        puVar2 = (undefined8 *)
                 ((long)&(puVar5->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_size_index + lVar12);
        ctx = (EVP_PKEY_CTX *)(puVar2 + 6);
        uVar10 = *puVar2;
        uVar7 = puVar2[1];
        uVar8 = puVar2[3];
        puVar3 = (undefined8 *)
                 ((long)&(puVar9->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_ + lVar12);
        *puVar3 = puVar2[2];
        puVar3[1] = uVar8;
        puVar3 = (undefined8 *)
                 ((long)&(puVar9->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .arrays.groups_size_index + lVar12);
        *puVar3 = uVar10;
        puVar3[1] = uVar7;
        uVar10 = puVar2[5];
        puVar3 = (undefined8 *)
                 ((long)&(puVar9->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                         .size_ctrl.ml + lVar12);
        *puVar3 = puVar2[4];
        puVar3[1] = uVar10;
        *puVar2 = 0x3f;
        puVar2[1] = 1;
        puVar2[2] = &boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage;
        puVar2[3] = 0;
        puVar2[4] = 0;
        puVar2[5] = 0;
        lVar12 = lVar12 + 0x30;
      } while (ctx != (EVP_PKEY_CTX *)pos);
    }
    sVar6 = this->len;
    puVar5 = this->data_;
    if ((EVP_PKEY_CTX *)(puVar5 + sVar6) != (EVP_PKEY_CTX *)pos) {
      ctx = (EVP_PKEY_CTX *)0x0;
      do {
        pEVar11 = ctx + (long)&pos->table_;
        uVar10 = *(undefined8 *)pEVar11;
        uVar7 = *(undefined8 *)(pEVar11 + 8);
        uVar8 = *(undefined8 *)(pEVar11 + 0x18);
        *(undefined8 *)(ctx + (long)puVar9 + lVar13 + 0x40) = *(undefined8 *)(pEVar11 + 0x10);
        *(undefined8 *)(ctx + (long)puVar9 + lVar13 + 0x40 + 8) = uVar8;
        *(undefined8 *)(ctx + (long)puVar9 + lVar13 + 0x30) = uVar10;
        *(undefined8 *)(ctx + (long)puVar9 + lVar13 + 0x30 + 8) = uVar7;
        uVar10 = *(undefined8 *)(pEVar11 + 0x28);
        *(undefined8 *)(ctx + (long)puVar9 + lVar13 + 0x50) = *(undefined8 *)(pEVar11 + 0x20);
        *(undefined8 *)(ctx + (long)puVar9 + lVar13 + 0x50 + 8) = uVar10;
        *(undefined8 *)pEVar11 = 0x3f;
        *(undefined8 *)(pEVar11 + 8) = 1;
        *(undefined1 **)(pEVar11 + 0x10) =
             &boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
        *(undefined8 *)(pEVar11 + 0x18) = 0;
        *(undefined8 *)(pEVar11 + 0x20) = 0;
        *(undefined8 *)(pEVar11 + 0x28) = 0;
        ctx = ctx + 0x30;
      } while (pEVar11 + 0x30 != (EVP_PKEY_CTX *)(puVar5 + sVar6));
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = uVar14;
  this->data_ = puVar9;
  return (pointer)((long)puVar9 + lVar13);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}